

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_cached_string.c
# Opt level: O0

void ht_feature_cached_string_push_map(HT_Timeline *timeline)

{
  HT_FeatureCachedString *pHVar1;
  HT_FeatureCachedString *f;
  HT_Timeline *timeline_local;
  
  pHVar1 = HT_FeatureCachedString_from_timeline(timeline);
  if (pHVar1 != (HT_FeatureCachedString *)0x0) {
    if (pHVar1->lock != (HT_Mutex *)0x0) {
      ht_mutex_lock(pHVar1->lock);
    }
    ht_hash_map_for_each(&pHVar1->static_hashes,ht_feature_cached_string_push_event,timeline);
    ht_hash_map_for_each(&pHVar1->dynamic_hashes,ht_feature_cached_string_push_event,timeline);
    if (pHVar1->lock != (HT_Mutex *)0x0) {
      ht_mutex_unlock(pHVar1->lock);
    }
    return;
  }
  __assert_fail("f",
                "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/lib/feature_cached_string.c"
                ,0x9c,"void ht_feature_cached_string_push_map(HT_Timeline *)");
}

Assistant:

void
ht_feature_cached_string_push_map(HT_Timeline* timeline)
{
    HT_FeatureCachedString* f = HT_FeatureCachedString_from_timeline(timeline);

    assert(f);

    HT_FCS_LOCK_(f);

    ht_hash_map_for_each(&f->static_hashes, ht_feature_cached_string_push_event, timeline);
    ht_hash_map_for_each(&f->dynamic_hashes, ht_feature_cached_string_push_event, timeline);

    HT_FCS_UNLOCK_(f);
}